

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

int recff_bit64_nary(jit_State *J,RecordFFData *rd)

{
  CTypeID CVar1;
  uint uVar2;
  TRef TVar3;
  TRef TVar4;
  long in_RSI;
  long in_RDI;
  TRef tr2;
  TRef tr;
  uint32_t ot;
  CType *ct;
  CTypeID aid;
  MSize i;
  CTypeID id;
  CTState *cts;
  TValue *in_stack_ffffffffffffff68;
  cTValue *in_stack_ffffffffffffff70;
  long lVar5;
  undefined4 in_stack_ffffffffffffff78;
  TRef in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_44;
  
  local_64 = 0;
  local_68 = 0;
  while (*(int *)(*(long *)(in_RDI + 0x88) + (ulong)local_68 * 4) != 0) {
    CVar1 = crec_bit64_type((CTState *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                            ,in_stack_ffffffffffffff70);
    if (local_64 < CVar1) {
      local_64 = CVar1;
    }
    local_68 = local_68 + 1;
  }
  if (local_64 == 0) {
    local_44 = 0;
  }
  else {
    uVar2 = *(int *)(in_RSI + 0x10) << 8 | local_64 + 10;
    TVar3 = crec_bit64_arg((jit_State *)CONCAT44(uVar2,in_stack_ffffffffffffff80),
                           (CType *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (TRef)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           in_stack_ffffffffffffff68);
    local_68 = 1;
    while (*(int *)(*(long *)(in_RDI + 0x88) + (ulong)local_68 * 4) != 0) {
      in_stack_ffffffffffffff7c =
           crec_bit64_arg((jit_State *)CONCAT44(uVar2,TVar3),
                          (CType *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (TRef)((ulong)in_stack_ffffffffffffff70 >> 0x20),in_stack_ffffffffffffff68
                         );
      *(short *)(in_RDI + 0xa4) = (short)uVar2;
      *(short *)(in_RDI + 0xa0) = (short)TVar3;
      *(short *)(in_RDI + 0xa2) = (short)in_stack_ffffffffffffff7c;
      TVar3 = lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                         );
      local_68 = local_68 + 1;
    }
    lVar5 = in_RDI;
    TVar4 = lj_ir_kint((jit_State *)CONCAT44(uVar2,TVar3),in_stack_ffffffffffffff7c);
    *(undefined2 *)(lVar5 + 0xa4) = 0x528a;
    *(short *)(lVar5 + 0xa0) = (short)TVar4;
    *(short *)(lVar5 + 0xa2) = (short)TVar3;
    TVar3 = lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    **(TRef **)(in_RDI + 0x88) = TVar3;
    local_44 = 1;
  }
  return local_44;
}

Assistant:

int LJ_FASTCALL recff_bit64_nary(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id = 0;
  MSize i;
  for (i = 0; J->base[i] != 0; i++) {
    CTypeID aid = crec_bit64_type(cts, &rd->argv[i]);
    if (id < aid) id = aid;  /* Determine highest type rank of all arguments. */
  }
  if (id) {
    CType *ct = ctype_get(cts, id);
    uint32_t ot = IRT(rd->data, id-CTID_INT64+IRT_I64);
    TRef tr = crec_bit64_arg(J, ct, J->base[0], &rd->argv[0]);
    for (i = 1; J->base[i] != 0; i++) {
      TRef tr2 = crec_bit64_arg(J, ct, J->base[i], &rd->argv[i]);
      tr = emitir(ot, tr, tr2);
    }
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
    return 1;
  }
  return 0;
}